

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall
httplib::Server::apply_ranges
          (Server *this,Request *req,Response *res,string *content_type,string *boundary)

{
  string *this_00;
  pointer ppVar1;
  pointer ppVar2;
  bool bVar3;
  EncodingType EVar4;
  iterator __position;
  size_t sVar5;
  string *content_length;
  pair<unsigned_long,_unsigned_long> pVar6;
  string length;
  allocator local_72;
  allocator local_71;
  key_type local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  content_length = boundary;
  if (0x10 < (ulong)((long)(req->ranges).
                           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(req->ranges).
                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    detail::make_multipart_data_boundary_abi_cxx11_();
    std::__cxx11::string::operator=((string *)boundary,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_70,"Content-Type",(allocator *)&local_50);
    __position = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&(res->headers)._M_t,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if ((_Rb_tree_header *)__position._M_node != &(res->headers)._M_t._M_impl.super__Rb_tree_header)
    {
      std::__cxx11::string::_M_assign((string *)content_type);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&res->headers,__position);
    }
    std::__cxx11::string::string((string *)&local_70,"Content-Type",&local_72);
    std::operator+(&local_50,"multipart/byteranges; boundary=",boundary);
    Response::set_header(res,&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  EVar4 = detail::encoding_type(req,res);
  sVar5 = (res->body)._M_string_length;
  if (sVar5 == 0) {
    sVar5 = res->content_length_;
    if (sVar5 == 0) {
      if ((res->content_provider_).super__Function_base._M_manager == (_Manager_type)0x0) {
        return;
      }
      if (res->is_chunked_content_provider_ != true) {
        return;
      }
      std::__cxx11::string::string((string *)&local_70,"Transfer-Encoding",&local_72);
      std::__cxx11::string::string((string *)&local_50,"chunked",&local_71);
      Response::set_header(res,&local_70,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      if (EVar4 == Brotli) {
        std::__cxx11::string::string((string *)&local_70,"Content-Encoding",&local_72);
        std::__cxx11::string::string((string *)&local_50,"br",&local_71);
        Response::set_header(res,&local_70,&local_50);
      }
      else {
        if (EVar4 != Gzip) {
          return;
        }
        std::__cxx11::string::string((string *)&local_70,"Content-Encoding",&local_72);
        std::__cxx11::string::string((string *)&local_50,"gzip",&local_71);
        Response::set_header(res,&local_70,&local_50);
      }
    }
    else {
      ppVar1 = (req->ranges).
               super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ppVar2 = (req->ranges).
               super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (ppVar1 != ppVar2) {
        if ((long)ppVar2 - (long)ppVar1 == 0x10) {
          pVar6 = detail::get_range_offset_and_length(req,sVar5,0);
          sVar5 = pVar6.second;
          detail::make_content_range_header_field_abi_cxx11_
                    (&local_70,(detail *)pVar6.first,sVar5,res->content_length_,
                     (size_t)content_length);
          std::__cxx11::string::string((string *)&local_50,"Content-Range",&local_72);
          Response::set_header(res,&local_50,&local_70);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
        }
        else {
          sVar5 = detail::get_multipart_ranges_data_length(req,res,boundary,content_type);
        }
      }
      std::__cxx11::string::string((string *)&local_70,"Content-Length",&local_72);
      std::__cxx11::to_string(&local_50,sVar5);
      Response::set_header(res,&local_70,&local_50);
    }
    goto LAB_001cc5e4;
  }
  ppVar1 = (req->ranges).
           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (req->ranges).
           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (ppVar1 != ppVar2) {
    this_00 = &res->body;
    if ((long)ppVar2 - (long)ppVar1 == 0x10) {
      pVar6 = detail::get_range_offset_and_length(req,sVar5,0);
      detail::make_content_range_header_field_abi_cxx11_
                (&local_70,(detail *)pVar6.first,pVar6.second,(res->body)._M_string_length,
                 (size_t)content_length);
      std::__cxx11::string::string((string *)&local_50,"Content-Range",&local_72);
      Response::set_header(res,&local_50,&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      if ((detail *)pVar6.first < (detail *)(res->body)._M_string_length) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)this_00);
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
LAB_001cc462:
        (res->body)._M_string_length = 0;
        *(res->body)._M_dataplus._M_p = '\0';
        res->status = 0x1a0;
      }
    }
    else {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      bVar3 = detail::make_multipart_ranges_data(req,res,boundary,content_type,&local_70);
      if (!bVar3) goto LAB_001cc462;
      std::__cxx11::string::swap((string *)this_00);
    }
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (EVar4 != None) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::to_string(&local_70,(res->body)._M_string_length);
  std::__cxx11::string::string((string *)&local_50,"Content-Length",&local_72);
  Response::set_header(res,&local_50,&local_70);
LAB_001cc5e4:
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

inline void Server::apply_ranges(const Request &req, Response &res,
                                 std::string &content_type,
                                 std::string &boundary) {
  if (req.ranges.size() > 1) {
    boundary = detail::make_multipart_data_boundary();

    auto it = res.headers.find("Content-Type");
    if (it != res.headers.end()) {
      content_type = it->second;
      res.headers.erase(it);
    }

    res.set_header("Content-Type",
                   "multipart/byteranges; boundary=" + boundary);
  }

  auto type = detail::encoding_type(req, res);

  if (res.body.empty()) {
    if (res.content_length_ > 0) {
      size_t length = 0;
      if (req.ranges.empty()) {
        length = res.content_length_;
      } else if (req.ranges.size() == 1) {
        auto offsets =
            detail::get_range_offset_and_length(req, res.content_length_, 0);
        auto offset = offsets.first;
        length = offsets.second;
        auto content_range = detail::make_content_range_header_field(
            offset, length, res.content_length_);
        res.set_header("Content-Range", content_range);
      } else {
        length = detail::get_multipart_ranges_data_length(req, res, boundary,
                                                          content_type);
      }
      res.set_header("Content-Length", std::to_string(length));
    } else {
      if (res.content_provider_) {
        if (res.is_chunked_content_provider_) {
          res.set_header("Transfer-Encoding", "chunked");
          if (type == detail::EncodingType::Gzip) {
            res.set_header("Content-Encoding", "gzip");
          } else if (type == detail::EncodingType::Brotli) {
            res.set_header("Content-Encoding", "br");
          }
        }
      }
    }
  } else {
    if (req.ranges.empty()) {
      ;
    } else if (req.ranges.size() == 1) {
      auto offsets =
          detail::get_range_offset_and_length(req, res.body.size(), 0);
      auto offset = offsets.first;
      auto length = offsets.second;
      auto content_range = detail::make_content_range_header_field(
          offset, length, res.body.size());
      res.set_header("Content-Range", content_range);
      if (offset < res.body.size()) {
        res.body = res.body.substr(offset, length);
      } else {
        res.body.clear();
        res.status = 416;
      }
    } else {
      std::string data;
      if (detail::make_multipart_ranges_data(req, res, boundary, content_type,
                                             data)) {
        res.body.swap(data);
      } else {
        res.body.clear();
        res.status = 416;
      }
    }

    if (type != detail::EncodingType::None) {
      std::unique_ptr<detail::compressor> compressor;
      std::string content_encoding;

      if (type == detail::EncodingType::Gzip) {
#ifdef CPPHTTPLIB_ZLIB_SUPPORT
        compressor = detail::make_unique<detail::gzip_compressor>();
        content_encoding = "gzip";
#endif
      } else if (type == detail::EncodingType::Brotli) {
#ifdef CPPHTTPLIB_BROTLI_SUPPORT
        compressor = detail::make_unique<detail::brotli_compressor>();
        content_encoding = "br";
#endif
      }

      if (compressor) {
        std::string compressed;
        if (compressor->compress(res.body.data(), res.body.size(), true,
                                 [&](const char *data, size_t data_len) {
                                   compressed.append(data, data_len);
                                   return true;
                                 })) {
          res.body.swap(compressed);
          res.set_header("Content-Encoding", content_encoding);
        }
      }
    }

    auto length = std::to_string(res.body.size());
    res.set_header("Content-Length", length);
  }
}